

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

void nifti_free_NBL(nifti_brick_list *NBL)

{
  long lVar1;
  
  if (NBL->bricks != (void **)0x0) {
    if (0 < NBL->nbricks) {
      lVar1 = 0;
      do {
        if (NBL->bricks[lVar1] != (void *)0x0) {
          free(NBL->bricks[lVar1]);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < NBL->nbricks);
    }
    free(NBL->bricks);
    NBL->bricks = (void **)0x0;
  }
  NBL->nbricks = 0;
  NBL->bsize = 0;
  return;
}

Assistant:

void nifti_free_NBL( nifti_brick_list * NBL )
{
   int c;

   if( NBL->bricks ){
      for( c = 0; c < NBL->nbricks; c++ )
         if( NBL->bricks[c] ) free(NBL->bricks[c]);
      free(NBL->bricks);
      NBL->bricks = NULL;
   }

   NBL->bsize = NBL->nbricks = 0;
}